

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O2

int read_double_partial_array(coda_cursor *cursor,long offset,long length,double *dst)

{
  coda_backend cVar1;
  int iVar2;
  coda_type *pcVar3;
  ulong uVar4;
  coda_cursor local_340;
  
  pcVar3 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  cVar1 = pcVar3->format;
  if (99 < cVar1) {
    pcVar3 = *(coda_type **)&pcVar3->type_class;
  }
  if ((*(coda_type **)(pcVar3 + 1))->type_class == coda_special_class) {
    memcpy(&local_340,cursor,0x310);
    if (0 < length) {
      iVar2 = coda_cursor_goto_array_element_by_index(&local_340,offset);
      if (iVar2 != 0) {
        return -1;
      }
      for (uVar4 = 0; length != uVar4; uVar4 = uVar4 + 1) {
        iVar2 = read_double(&local_340,dst);
        if (iVar2 != 0) {
          return -1;
        }
        if ((uVar4 < length - 1U) &&
           (iVar2 = coda_cursor_goto_next_array_element(&local_340), iVar2 != 0)) {
          return -1;
        }
        dst = dst + 1;
      }
    }
    iVar2 = 0;
  }
  else {
    switch(cVar1) {
    case coda_backend_memory:
      iVar2 = coda_mem_cursor_read_double_partial_array(cursor,offset,length,dst);
      return iVar2;
    case coda_backend_hdf4:
      iVar2 = -0xb;
      break;
    case coda_backend_hdf5:
      iVar2 = -0xd;
      break;
    case coda_backend_cdf:
      iVar2 = coda_cdf_cursor_read_double_partial_array(cursor,offset,length,dst);
      return iVar2;
    case coda_backend_netcdf:
      iVar2 = coda_netcdf_cursor_read_double_partial_array(cursor,offset,length,dst);
      return iVar2;
    default:
      if (cVar1 == coda_backend_binary) {
        iVar2 = coda_bin_cursor_read_double_partial_array(cursor,offset,length,dst);
        return iVar2;
      }
      if (cVar1 == coda_backend_ascii) {
        iVar2 = coda_ascii_cursor_read_double_partial_array(cursor,offset,length,dst);
        return iVar2;
      }
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                    ,0x6b6,
                    "int read_double_partial_array(const coda_cursor *, long, long, double *)");
    }
    coda_set_error(iVar2,(char *)0x0);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static int read_double_partial_array(const coda_cursor *cursor, long offset, long length, double *dst)
{
    coda_type_array *type;

    type = (coda_type_array *)coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    if (type->base_type->type_class == coda_special_class)
    {
        /* arrays of special types should be explicitly iterated */
        return read_partial_array(cursor, (read_function)&read_double, offset, length, (uint8_t *)dst, sizeof(double));
    }
    switch (cursor->stack[cursor->n - 1].type->backend)
    {
        case coda_backend_ascii:
            return coda_ascii_cursor_read_double_partial_array(cursor, offset, length, dst);
        case coda_backend_binary:
            return coda_bin_cursor_read_double_partial_array(cursor, offset, length, dst);
        case coda_backend_memory:
            return coda_mem_cursor_read_double_partial_array(cursor, offset, length, dst);
        case coda_backend_hdf4:
#ifdef HAVE_HDF4
            return coda_hdf4_cursor_read_double_partial_array(cursor, offset, length, dst);
#else
            coda_set_error(CODA_ERROR_NO_HDF4_SUPPORT, NULL);
            return -1;
#endif
        case coda_backend_hdf5:
#ifdef HAVE_HDF5
            return coda_hdf5_cursor_read_double_partial_array(cursor, offset, length, dst);
#else
            coda_set_error(CODA_ERROR_NO_HDF5_SUPPORT, NULL);
            return -1;
#endif
        case coda_backend_cdf:
            return coda_cdf_cursor_read_double_partial_array(cursor, offset, length, dst);
        case coda_backend_netcdf:
            return coda_netcdf_cursor_read_double_partial_array(cursor, offset, length, dst);
        case coda_backend_grib:
            break;
    }

    assert(0);
    exit(1);
}